

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_BKPT(DisasContext_conflict1 *s,arg_BKPT *a)

{
  int iVar1;
  uint32_t syn;
  arg_BKPT *a_local;
  DisasContext_conflict1 *s_local;
  
  iVar1 = arm_dc_feature(s,0xf);
  if (iVar1 != 0) {
    arm_dc_feature(s,9);
    syn = syn_aa32_bkpt(a->imm,false);
    gen_exception_bkpt_insn(s,syn);
  }
  return iVar1 != 0;
}

Assistant:

static bool trans_BKPT(DisasContext *s, arg_BKPT *a)
{
    if (!ENABLE_ARCH_5) {
        return false;
    }
    if (arm_dc_feature(s, ARM_FEATURE_M) && false && // semihosting_enabled() &&
        !IS_USER(s) &&
        (a->imm == 0xab)) {
        gen_exception_internal_insn(s, s->pc_curr, EXCP_SEMIHOST);
    } else {
        gen_exception_bkpt_insn(s, syn_aa32_bkpt(a->imm, false));
    }
    return true;
}